

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zello_log.h
# Opt level: O0

string * to_string_abi_cxx11_(ze_image_format_layout_t layout)

{
  int in_ESI;
  undefined4 in_register_0000003c;
  string *this;
  __cxx11 local_60 [33];
  allocator local_3f;
  allocator local_3e;
  allocator local_3d;
  allocator local_3c;
  allocator local_3b;
  allocator local_3a;
  allocator local_39;
  allocator local_38;
  allocator local_37;
  allocator local_36;
  allocator local_35;
  allocator local_34;
  allocator local_33;
  allocator local_32;
  allocator local_31;
  allocator local_30;
  allocator local_2f;
  allocator local_2e;
  allocator local_2d;
  allocator local_2c;
  allocator local_2b;
  allocator local_2a;
  allocator local_29;
  allocator local_28;
  allocator local_27;
  allocator local_26;
  allocator local_25 [16];
  allocator local_15 [5];
  string *psStack_10;
  ze_image_format_layout_t layout_local;
  
  this = (string *)CONCAT44(in_register_0000003c,layout);
  psStack_10 = this;
  if (in_ESI == 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(this,"ZE_IMAGE_FORMAT_LAYOUT_8",local_15);
    std::allocator<char>::~allocator((allocator<char> *)local_15);
  }
  else if (in_ESI == 1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(this,"ZE_IMAGE_FORMAT_LAYOUT_16",local_25);
    std::allocator<char>::~allocator((allocator<char> *)local_25);
  }
  else if (in_ESI == 2) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(this,"ZE_IMAGE_FORMAT_LAYOUT_32",&local_26);
    std::allocator<char>::~allocator((allocator<char> *)&local_26);
  }
  else if (in_ESI == 3) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(this,"ZE_IMAGE_FORMAT_LAYOUT_8_8",&local_27);
    std::allocator<char>::~allocator((allocator<char> *)&local_27);
  }
  else if (in_ESI == 4) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(this,"ZE_IMAGE_FORMAT_LAYOUT_8_8_8_8",&local_28);
    std::allocator<char>::~allocator((allocator<char> *)&local_28);
  }
  else if (in_ESI == 5) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(this,"ZE_IMAGE_FORMAT_LAYOUT_16_16",&local_29);
    std::allocator<char>::~allocator((allocator<char> *)&local_29);
  }
  else if (in_ESI == 6) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(this,"ZE_IMAGE_FORMAT_LAYOUT_16_16_16_16",&local_2a);
    std::allocator<char>::~allocator((allocator<char> *)&local_2a);
  }
  else if (in_ESI == 7) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(this,"ZE_IMAGE_FORMAT_LAYOUT_32_32",&local_2b);
    std::allocator<char>::~allocator((allocator<char> *)&local_2b);
  }
  else if (in_ESI == 8) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(this,"ZE_IMAGE_FORMAT_LAYOUT_32_32_32_32",&local_2c);
    std::allocator<char>::~allocator((allocator<char> *)&local_2c);
  }
  else if (in_ESI == 9) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(this,"ZE_IMAGE_FORMAT_LAYOUT_10_10_10_2",&local_2d);
    std::allocator<char>::~allocator((allocator<char> *)&local_2d);
  }
  else if (in_ESI == 10) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(this,"ZE_IMAGE_FORMAT_LAYOUT_11_11_10",&local_2e);
    std::allocator<char>::~allocator((allocator<char> *)&local_2e);
  }
  else if (in_ESI == 0xb) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(this,"ZE_IMAGE_FORMAT_LAYOUT_5_6_5",&local_2f);
    std::allocator<char>::~allocator((allocator<char> *)&local_2f);
  }
  else if (in_ESI == 0xc) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(this,"ZE_IMAGE_FORMAT_LAYOUT_5_5_5_1",&local_30);
    std::allocator<char>::~allocator((allocator<char> *)&local_30);
  }
  else if (in_ESI == 0xd) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(this,"ZE_IMAGE_FORMAT_LAYOUT_4_4_4_4",&local_31);
    std::allocator<char>::~allocator((allocator<char> *)&local_31);
  }
  else if (in_ESI == 0xe) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(this,"ZE_IMAGE_FORMAT_LAYOUT_Y8",&local_32);
    std::allocator<char>::~allocator((allocator<char> *)&local_32);
  }
  else if (in_ESI == 0xf) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(this,"ZE_IMAGE_FORMAT_LAYOUT_NV12",&local_33);
    std::allocator<char>::~allocator((allocator<char> *)&local_33);
  }
  else if (in_ESI == 0x10) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(this,"ZE_IMAGE_FORMAT_LAYOUT_YUYV",&local_34);
    std::allocator<char>::~allocator((allocator<char> *)&local_34);
  }
  else if (in_ESI == 0x11) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(this,"ZE_IMAGE_FORMAT_LAYOUT_VYUY",&local_35);
    std::allocator<char>::~allocator((allocator<char> *)&local_35);
  }
  else if (in_ESI == 0x12) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(this,"ZE_IMAGE_FORMAT_LAYOUT_YVYU",&local_36);
    std::allocator<char>::~allocator((allocator<char> *)&local_36);
  }
  else if (in_ESI == 0x13) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(this,"ZE_IMAGE_FORMAT_LAYOUT_UYVY",&local_37);
    std::allocator<char>::~allocator((allocator<char> *)&local_37);
  }
  else if (in_ESI == 0x14) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(this,"ZE_IMAGE_FORMAT_LAYOUT_AYUV",&local_38);
    std::allocator<char>::~allocator((allocator<char> *)&local_38);
  }
  else if (in_ESI == 0x15) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(this,"ZE_IMAGE_FORMAT_LAYOUT_P010",&local_39);
    std::allocator<char>::~allocator((allocator<char> *)&local_39);
  }
  else if (in_ESI == 0x16) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(this,"ZE_IMAGE_FORMAT_LAYOUT_Y410",&local_3a);
    std::allocator<char>::~allocator((allocator<char> *)&local_3a);
  }
  else if (in_ESI == 0x17) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(this,"ZE_IMAGE_FORMAT_LAYOUT_P012",&local_3b);
    std::allocator<char>::~allocator((allocator<char> *)&local_3b);
  }
  else if (in_ESI == 0x18) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(this,"ZE_IMAGE_FORMAT_LAYOUT_Y16",&local_3c);
    std::allocator<char>::~allocator((allocator<char> *)&local_3c);
  }
  else if (in_ESI == 0x19) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(this,"ZE_IMAGE_FORMAT_LAYOUT_P016",&local_3d);
    std::allocator<char>::~allocator((allocator<char> *)&local_3d);
  }
  else if (in_ESI == 0x1a) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(this,"ZE_IMAGE_FORMAT_LAYOUT_Y216",&local_3e);
    std::allocator<char>::~allocator((allocator<char> *)&local_3e);
  }
  else if (in_ESI == 0x1b) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(this,"ZE_IMAGE_FORMAT_LAYOUT_P216",&local_3f);
    std::allocator<char>::~allocator((allocator<char> *)&local_3f);
  }
  else {
    std::__cxx11::to_string(local_60,in_ESI);
    std::operator+((char *)this,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   "Unknown ze_image_format_layout_t value: ");
    std::__cxx11::string::~string((string *)local_60);
  }
  return this;
}

Assistant:

std::string to_string(const ze_image_format_layout_t layout) {
  if (layout == ZE_IMAGE_FORMAT_LAYOUT_8) {
    return "ZE_IMAGE_FORMAT_LAYOUT_8";
  } else if (layout == ZE_IMAGE_FORMAT_LAYOUT_16) {
    return "ZE_IMAGE_FORMAT_LAYOUT_16";
  } else if (layout == ZE_IMAGE_FORMAT_LAYOUT_32) {
    return "ZE_IMAGE_FORMAT_LAYOUT_32";
  } else if (layout == ZE_IMAGE_FORMAT_LAYOUT_8_8) {
    return "ZE_IMAGE_FORMAT_LAYOUT_8_8";
  } else if (layout == ZE_IMAGE_FORMAT_LAYOUT_8_8_8_8) {
    return "ZE_IMAGE_FORMAT_LAYOUT_8_8_8_8";
  } else if (layout == ZE_IMAGE_FORMAT_LAYOUT_16_16) {
    return "ZE_IMAGE_FORMAT_LAYOUT_16_16";
  } else if (layout == ZE_IMAGE_FORMAT_LAYOUT_16_16_16_16) {
    return "ZE_IMAGE_FORMAT_LAYOUT_16_16_16_16";
  } else if (layout == ZE_IMAGE_FORMAT_LAYOUT_32_32) {
    return "ZE_IMAGE_FORMAT_LAYOUT_32_32";
  } else if (layout == ZE_IMAGE_FORMAT_LAYOUT_32_32_32_32) {
    return "ZE_IMAGE_FORMAT_LAYOUT_32_32_32_32";
  } else if (layout == ZE_IMAGE_FORMAT_LAYOUT_10_10_10_2) {
    return "ZE_IMAGE_FORMAT_LAYOUT_10_10_10_2";
  } else if (layout == ZE_IMAGE_FORMAT_LAYOUT_11_11_10) {
    return "ZE_IMAGE_FORMAT_LAYOUT_11_11_10";
  } else if (layout == ZE_IMAGE_FORMAT_LAYOUT_5_6_5) {
    return "ZE_IMAGE_FORMAT_LAYOUT_5_6_5";
  } else if (layout == ZE_IMAGE_FORMAT_LAYOUT_5_5_5_1) {
    return "ZE_IMAGE_FORMAT_LAYOUT_5_5_5_1";
  } else if (layout == ZE_IMAGE_FORMAT_LAYOUT_4_4_4_4) {
    return "ZE_IMAGE_FORMAT_LAYOUT_4_4_4_4";
  } else if (layout == ZE_IMAGE_FORMAT_LAYOUT_Y8) {
    return "ZE_IMAGE_FORMAT_LAYOUT_Y8";
  } else if (layout == ZE_IMAGE_FORMAT_LAYOUT_NV12) {
    return "ZE_IMAGE_FORMAT_LAYOUT_NV12";
  } else if (layout == ZE_IMAGE_FORMAT_LAYOUT_YUYV) {
    return "ZE_IMAGE_FORMAT_LAYOUT_YUYV";
  } else if (layout == ZE_IMAGE_FORMAT_LAYOUT_VYUY) {
    return "ZE_IMAGE_FORMAT_LAYOUT_VYUY";
  } else if (layout == ZE_IMAGE_FORMAT_LAYOUT_YVYU) {
    return "ZE_IMAGE_FORMAT_LAYOUT_YVYU";
  } else if (layout == ZE_IMAGE_FORMAT_LAYOUT_UYVY) {
    return "ZE_IMAGE_FORMAT_LAYOUT_UYVY";
  } else if (layout == ZE_IMAGE_FORMAT_LAYOUT_AYUV) {
    return "ZE_IMAGE_FORMAT_LAYOUT_AYUV";
  } else if (layout == ZE_IMAGE_FORMAT_LAYOUT_P010) {
    return "ZE_IMAGE_FORMAT_LAYOUT_P010";
  } else if (layout == ZE_IMAGE_FORMAT_LAYOUT_Y410) {
    return "ZE_IMAGE_FORMAT_LAYOUT_Y410";
  } else if (layout == ZE_IMAGE_FORMAT_LAYOUT_P012) {
    return "ZE_IMAGE_FORMAT_LAYOUT_P012";
  } else if (layout == ZE_IMAGE_FORMAT_LAYOUT_Y16) {
    return "ZE_IMAGE_FORMAT_LAYOUT_Y16";
  } else if (layout == ZE_IMAGE_FORMAT_LAYOUT_P016) {
    return "ZE_IMAGE_FORMAT_LAYOUT_P016";
  } else if (layout == ZE_IMAGE_FORMAT_LAYOUT_Y216) {
    return "ZE_IMAGE_FORMAT_LAYOUT_Y216";
  } else if (layout == ZE_IMAGE_FORMAT_LAYOUT_P216) {
    return "ZE_IMAGE_FORMAT_LAYOUT_P216";
  } else {
    return "Unknown ze_image_format_layout_t value: " +
           std::to_string(static_cast<int>(layout));
  }
}